

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

unsigned_short __thiscall
libdivide::divider<unsigned_short,_(libdivide::Branching)0>::recover
          (divider<unsigned_short,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  divider<unsigned_short,_(libdivide::Branching)0> *this_local;
  uint16_t full_q;
  uint32_t rem;
  uint16_t half_q;
  uint32_t d;
  uint32_t half_n;
  uint16_t rem_ignored;
  uint16_t hi_dividend;
  uint8_t shift;
  uint8_t more;
  unsigned_short local_18;
  uint16_t result;
  uint32_t n;
  uint local_4;
  
  bVar1 = (this->div).denom.more;
  bVar2 = bVar1 & 0x1f;
  if ((this->div).denom.magic == 0) {
    local_18 = (unsigned_short)(1 << bVar2);
  }
  else if ((bVar1 & 0x40) == 0) {
    local_4 = (1 << bVar2) << 0x10;
    local_18 = (short)(local_4 / (this->div).denom.magic) + 1;
  }
  else {
    uVar3 = 1 << (bVar2 + 0x10 & 0x1f);
    uVar4 = (this->div).denom.magic | 0x10000;
    local_18 = (short)(uVar3 / uVar4) * 2 + (ushort)(uVar4 <= uVar3 % uVar4 << 1) + 1;
  }
  return local_18;
}

Assistant:

T recover() const { return div.recover(); }